

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

int linenoiseEditInsert(linenoiseState *l,char c)

{
  ssize_t sVar1;
  char local_19;
  linenoiseState *plStack_18;
  char c_local;
  linenoiseState *l_local;
  
  if (l->len < l->buflen) {
    local_19 = c;
    plStack_18 = l;
    if (l->len == l->pos) {
      l->buf[l->pos] = c;
      l->pos = l->pos + 1;
      l->len = l->len + 1;
      l->buf[l->len] = '\0';
      if ((mlmode == 0) && (l->plen + l->len < l->cols)) {
        sVar1 = write(l->ofd,&local_19,1);
        if (sVar1 == -1) {
          return -1;
        }
      }
      else {
        linenoiseRefreshLine();
      }
    }
    else {
      memmove(l->buf + l->pos + 1,l->buf + l->pos,l->len - l->pos);
      plStack_18->buf[plStack_18->pos] = local_19;
      plStack_18->len = plStack_18->len + 1;
      plStack_18->pos = plStack_18->pos + 1;
      plStack_18->buf[plStack_18->len] = '\0';
      linenoiseRefreshLine();
    }
  }
  return 0;
}

Assistant:

int linenoiseEditInsert(struct linenoiseState *l, char c) {
    if (l->len < l->buflen) {
        if (l->len == l->pos) {
            l->buf[l->pos] = c;
            l->pos++;
            l->len++;
            l->buf[l->len] = '\0';
            if ((!mlmode && l->plen+l->len < l->cols) /* || mlmode */) {
                /* Avoid a full update of the line in the
                 * trivial case. */
                if (write(l->ofd,&c,1) == -1) return -1;
            } else {
                linenoiseRefreshLine();
            }
        } else {
            memmove(l->buf+l->pos+1,l->buf+l->pos,l->len-l->pos);
            l->buf[l->pos] = c;
            l->len++;
            l->pos++;
            l->buf[l->len] = '\0';
            linenoiseRefreshLine();
        }
    }
    return 0;
}